

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigMiter(Abc_Aig_t *pMan,Vec_Ptr_t *vPairs,int fImplic)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p1;
  int local_28;
  int i;
  int fImplic_local;
  Vec_Ptr_t *vPairs_local;
  Abc_Aig_t *pMan_local;
  
  if (vPairs->nSize == 0) {
    pAVar1 = Abc_AigConst1(pMan->pNtkAig);
    pMan_local = (Abc_Aig_t *)Abc_ObjNot(pAVar1);
  }
  else {
    if (vPairs->nSize % 2 != 0) {
      __assert_fail("vPairs->nSize % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                    ,0x31a,"Abc_Obj_t *Abc_AigMiter(Abc_Aig_t *, Vec_Ptr_t *, int)");
    }
    if (fImplic == 0) {
      for (local_28 = 0; local_28 < vPairs->nSize; local_28 = local_28 + 2) {
        pAVar1 = Abc_AigXor(pMan,(Abc_Obj_t *)vPairs->pArray[local_28],
                            (Abc_Obj_t *)vPairs->pArray[local_28 + 1]);
        vPairs->pArray[local_28 / 2] = pAVar1;
      }
    }
    else {
      for (local_28 = 0; local_28 < vPairs->nSize; local_28 = local_28 + 2) {
        pAVar1 = (Abc_Obj_t *)vPairs->pArray[local_28];
        p1 = Abc_ObjNot((Abc_Obj_t *)vPairs->pArray[local_28 + 1]);
        pAVar1 = Abc_AigAnd(pMan,pAVar1,p1);
        vPairs->pArray[local_28 / 2] = pAVar1;
      }
    }
    vPairs->nSize = vPairs->nSize / 2;
    pMan_local = (Abc_Aig_t *)Abc_AigMiter_rec(pMan,(Abc_Obj_t **)vPairs->pArray,vPairs->nSize);
  }
  return (Abc_Obj_t *)pMan_local;
}

Assistant:

Abc_Obj_t * Abc_AigMiter( Abc_Aig_t * pMan, Vec_Ptr_t * vPairs, int fImplic )
{
    int i;
    if ( vPairs->nSize == 0 )
        return Abc_ObjNot( Abc_AigConst1(pMan->pNtkAig) );
    assert( vPairs->nSize % 2 == 0 );
    // go through the cubes of the node's SOP
    if ( fImplic )
    {
        for ( i = 0; i < vPairs->nSize; i += 2 )
            vPairs->pArray[i/2] = Abc_AigAnd( pMan, (Abc_Obj_t *)vPairs->pArray[i], Abc_ObjNot((Abc_Obj_t *)vPairs->pArray[i+1]) );
    }
    else
    {
        for ( i = 0; i < vPairs->nSize; i += 2 )
            vPairs->pArray[i/2] = Abc_AigXor( pMan, (Abc_Obj_t *)vPairs->pArray[i], (Abc_Obj_t *)vPairs->pArray[i+1] );
    }
    vPairs->nSize = vPairs->nSize/2;
    return Abc_AigMiter_rec( pMan, (Abc_Obj_t **)vPairs->pArray, vPairs->nSize );
}